

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_orthographic_transform
               (ALLEGRO_TRANSFORM *trans,float left,float top,float n,float right,float bottom,
               float f)

{
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  ALLEGRO_TRANSFORM tmp;
  float delta_z;
  float delta_y;
  float delta_x;
  float local_6c;
  float local_58;
  float local_44;
  float local_3c;
  
  fVar1 = in_XMM5_Da - in_XMM2_Da;
  al_identity_transform((ALLEGRO_TRANSFORM *)&local_6c);
  local_6c = 2.0 / (in_XMM3_Da - in_XMM0_Da);
  local_58 = 2.0 / (in_XMM1_Da - in_XMM4_Da);
  local_44 = 2.0 / fVar1;
  local_3c = -(in_XMM3_Da + in_XMM0_Da) / (in_XMM3_Da - in_XMM0_Da);
  al_compose_transform
            ((ALLEGRO_TRANSFORM *)CONCAT44(fVar1,0x3f800000),
             (ALLEGRO_TRANSFORM *)
             CONCAT44(-(in_XMM5_Da + in_XMM2_Da) / fVar1,
                      -(in_XMM1_Da + in_XMM4_Da) / (in_XMM1_Da - in_XMM4_Da)));
  return;
}

Assistant:

void al_orthographic_transform(ALLEGRO_TRANSFORM *trans,
   float left, float top, float n,
   float right, float bottom, float f)
{
   float delta_x = right - left;
   float delta_y = top - bottom;
   float delta_z = f - n;
   ALLEGRO_TRANSFORM tmp;

   al_identity_transform(&tmp);

   tmp.m[0][0] = 2.0f / delta_x;
   tmp.m[1][1] = 2.0f / delta_y;
   tmp.m[2][2] = 2.0f / delta_z;
   tmp.m[3][0] = -(right + left) / delta_x;
   tmp.m[3][1] = -(top + bottom) / delta_y;
   tmp.m[3][2] = -(f + n) / delta_z;
   tmp.m[3][3] = 1.0f;

   al_compose_transform(trans, &tmp);
}